

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

void __thiscall S2Loop::S2Loop(S2Loop *this,S2Cell *cell)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  S2Point *pSVar4;
  Vector3<double> *local_68;
  S2Point local_40;
  int local_28;
  int i;
  S2Cell *local_18;
  S2Cell *cell_local;
  S2Loop *this_local;
  
  local_18 = cell;
  cell_local = (S2Cell *)this;
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Loop_0062e2c0;
  this->depth_ = 0;
  this->num_vertices_ = 4;
  uVar2 = (ulong)this->num_vertices_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x18),0);
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pSVar4 = (S2Point *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_68 = pSVar4;
    do {
      Vector3<double>::Vector3(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != pSVar4 + uVar2);
  }
  this->vertices_ = pSVar4;
  this->owns_vertices_ = true;
  this->s2debug_override_ = ALLOW;
  this->origin_inside_ = false;
  std::atomic<int>::atomic(&this->unindexed_contains_calls_,0);
  S2LatLngRect::S2LatLngRect(&this->bound_);
  S2LatLngRect::S2LatLngRect(&this->subregion_bound_);
  MutableS2ShapeIndex::MutableS2ShapeIndex(&this->index_);
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    S2Cell::GetVertex(&local_40,local_18,local_28);
    pSVar4 = this->vertices_ + local_28;
    pSVar4->c_[0] = local_40.c_[0];
    pSVar4->c_[1] = local_40.c_[1];
    pSVar4->c_[2] = local_40.c_[2];
  }
  InitOriginAndBound(this);
  return;
}

Assistant:

S2Loop::S2Loop(const S2Cell& cell)
    : depth_(0),
      num_vertices_(4),
      vertices_(new S2Point[num_vertices_]),
      owns_vertices_(true),
      s2debug_override_(S2Debug::ALLOW),
      unindexed_contains_calls_(0) {
  for (int i = 0; i < 4; ++i) {
    vertices_[i] = cell.GetVertex(i);
  }
  // We recompute the bounding rectangle ourselves, since S2Cell uses a
  // different method and we need all the bounds to be consistent.
  InitOriginAndBound();
}